

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

void Abc_NtkLatchPipe(Abc_Ntk_t *pNtk,int nLatches)

{
  uint uVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pAVar2;
  char *pName;
  uint uVar3;
  int i;
  int iVar4;
  Abc_Obj_t *pFaninNew;
  int Num;
  int iVar5;
  bool bVar6;
  uint local_4c;
  
  if (nLatches < 1) {
    return;
  }
  local_4c = pNtk->vPis->nSize * nLatches;
  if (1 < local_4c) {
    uVar3 = 0;
    for (uVar1 = local_4c - 1; local_4c = uVar3, uVar1 != 0; uVar1 = uVar1 / 10) {
      uVar3 = uVar3 + 1;
    }
  }
  p = Vec_PtrAlloc(100);
  iVar4 = 0;
  i = 0;
  do {
    if (pNtk->vPis->nSize <= i) {
      Vec_PtrFree(p);
      Abc_NtkLogicMakeSimpleCos(pNtk,0);
      return;
    }
    pNode = Abc_NtkPi(pNtk,i);
    Abc_NodeCollectFanouts(pNode,p);
    pFaninNew = pNode;
    iVar5 = nLatches;
    Num = iVar4;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      pAVar2 = Abc_NtkCreateLatch(pNtk);
      Abc_ObjAddFanin(pAVar2,pFaninNew);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                      ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
      }
      pAVar2->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
      pName = Abc_ObjNameDummy("LL",Num,local_4c);
      Abc_ObjAssignName(pAVar2,pName,(char *)0x0);
      Num = Num + 1;
      pFaninNew = pAVar2;
    }
    for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar5);
      Abc_ObjPatchFanin(pAVar2,pNode,pFaninNew);
    }
    i = i + 1;
    iVar4 = iVar4 + nLatches;
  } while( true );
}

Assistant:

void Abc_NtkLatchPipe( Abc_Ntk_t * pNtk, int nLatches )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pLatch, * pFanin, * pFanout;
    int i, k, nTotal, nDigits;
    if ( nLatches < 1 )
        return;
    nTotal = nLatches * Abc_NtkPiNum(pNtk);
    nDigits = Abc_Base10Log( nTotal );
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        // remember current fanins of the PI
        Abc_NodeCollectFanouts( pObj, vNodes );
        // create the latches
        for ( pFanin = pObj, k = 0; k < nLatches; k++, pFanin = pLatch )
        {
            pLatch = Abc_NtkCreateLatch( pNtk );
            Abc_ObjAddFanin( pLatch, pFanin );
            Abc_LatchSetInitDc( pLatch );
            // create the name of the new latch
            Abc_ObjAssignName( pLatch, Abc_ObjNameDummy("LL", i*nLatches + k, nDigits), NULL );
        }
        // patch the PI fanouts
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pFanout, k )
            Abc_ObjPatchFanin( pFanout, pObj, pFanin );
    }
    Vec_PtrFree( vNodes );
    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
}